

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_fun.c
# Opt level: O3

void ex_toint(t_expr *e,long argc,ex_ex *argv,ex_ex *optr)

{
  t_float *ptVar1;
  t_float *ptVar2;
  long lVar3;
  int iVar4;
  
  lVar3 = argv->ex_type;
  if (lVar3 - 0xeU < 2) {
    if (optr->ex_type == 0xf) {
      ptVar2 = (optr->ex_cont).v_vec;
    }
    else {
      optr->ex_type = 0xf;
      ptVar2 = (t_float *)malloc((long)e->exp_vsize << 2);
      (optr->ex_cont).v_vec = ptVar2;
    }
    iVar4 = e->exp_vsize;
    if (iVar4 != 0) {
      ptVar1 = (argv->ex_cont).v_vec;
      lVar3 = 0;
      do {
        ptVar2[lVar3] = (float)(int)ptVar1[lVar3];
        lVar3 = lVar3 + 1;
      } while (iVar4 != (int)lVar3);
    }
    return;
  }
  if (lVar3 == 2) {
    if (optr->ex_type != 0xf) {
      optr->ex_type = 2;
      (optr->ex_cont).v_flt = (float)(int)(argv->ex_cont).v_flt;
      return;
    }
    ptVar2 = (optr->ex_cont).v_vec;
    iVar4 = (int)(argv->ex_cont).v_flt;
  }
  else {
    if (lVar3 != 1) {
      pd_error(e,"expr: FUNV_EVAL_UNARY(%d): bad left type %ld\n",0x22b);
      return;
    }
    if (optr->ex_type != 0xf) {
      optr->ex_type = 1;
      optr->ex_cont = (anon_union_8_5_735de1bb_for_ex_cont)SEXT48((argv->ex_cont).v_flt);
      return;
    }
    ptVar2 = (optr->ex_cont).v_vec;
    iVar4 = *(int *)&argv->ex_cont;
  }
  ex_mkvector(ptVar2,(float)iVar4,e->exp_vsize);
  return;
}

Assistant:

static void
ex_toint(t_expr *e, long int argc, struct ex_ex *argv, struct ex_ex *optr)
{
        struct ex_ex *left;
        t_float *op; /* output pointer */
        t_float *lp, *rp;         /* left and right vector pointers */
        t_float scalar;
        int j;

        left = argv++;

#define toint(x)        ((int)(x))
                FUNC_EVAL_UNARY(left, toint, (int), optr, 0);
        }